

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1185e52::QChildProcess::QChildProcess(QChildProcess *this,QProcessPrivate *d)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QProcessPrivate *in_RSI;
  EVP_PKEY_CTX *ctx;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QChildProcess *in_stack_ffffffffffffff38;
  QChildProcess *in_stack_ffffffffffffff40;
  QProcessPrivate *pQVar4;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int errnoCode;
  QUtf8StringView in_stack_ffffffffffffffa0;
  QProcessEnvironmentPrivate *in_stack_ffffffffffffffb8;
  CharPointerList *in_stack_ffffffffffffffc0;
  QString *in_stack_ffffffffffffffc8;
  CharPointerList *in_stack_ffffffffffffffd0;
  ProcessError error;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_RSI;
  resolveExecutable((QString *)(in_RDI + 1));
  CharPointerList::CharPointerList
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (QStringList *)in_stack_ffffffffffffffc0);
  QString::~QString((QString *)0x7a1905);
  errnoCode = (int)((ulong)(in_RDI + 5) >> 0x20);
  QProcessPrivate::environmentPrivate((QProcessPrivate *)0x7a191d);
  CharPointerList::CharPointerList(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined4 *)(in_RDI + 0x19) = 0xfffffffe;
  bVar2 = usingVfork(in_stack_ffffffffffffff40);
  *(bool *)((long)in_RDI + 0xcc) = bVar2;
  *(undefined4 *)(in_RDI + 0x1a) = 1;
  bVar2 = QString::isEmpty((QString *)0x7a1974);
  if (!bVar2) {
    QFile::encodeName((QString *)in_stack_ffffffffffffff38);
    iVar3 = opendirfd((QByteArray *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    *(int *)(in_RDI + 0x19) = iVar3;
    QByteArray::~QByteArray((QByteArray *)0x7a19c6);
    if (*(int *)(in_RDI + 0x19) < 0) {
      pQVar4 = in_RSI;
      QBasicUtf8StringView<false>::QBasicUtf8StringView<char[6],_true>
                ((QBasicUtf8StringView<false> *)CONCAT44(iVar3,in_stack_ffffffffffffff50),
                 (char (*) [6])in_RSI);
      error = (ProcessError)((ulong)pQVar4 >> 0x20);
      errorMessageForSyscall(in_stack_ffffffffffffffa0,errnoCode);
      ctx = (EVP_PKEY_CTX *)0x0;
      QProcessPrivate::setErrorAndEmit
                ((QProcessPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffff50),error,
                 (QString *)in_stack_ffffffffffffff40);
      QString::~QString((QString *)0x7a1a2b);
      QProcessPrivate::cleanup(in_RSI,ctx);
      *(undefined1 *)((long)in_RDI + 0xcc) = 0;
      goto LAB_007a1aec;
    }
  }
  maybeBlockSignals(in_stack_ffffffffffffff38);
  disableThreadCancellations((QChildProcess *)0x7a1aec);
LAB_007a1aec:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QChildProcess(QProcessPrivate *d)
        : d(d), argv(resolveExecutable(d->program), d->arguments),
          envp(d->environmentPrivate())
    {
        // Open the working directory first, because this operation can fail.
        // That way, if it does, we don't have anything to clean up.
        if (!d->workingDirectory.isEmpty()) {
            workingDirectory = opendirfd(QFile::encodeName(d->workingDirectory));
            if (workingDirectory < 0) {
                d->setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("chdir"));
                d->cleanup();

                // make sure our destructor does nothing
                isUsingVfork = false;
                return;
            }
        }

        // Block Unix signals, to ensure the user's handlers aren't run in the
        // child side and do something weird, especially if the handler and the
        // user of QProcess are completely different codebases.
        maybeBlockSignals();

        // Disable PThread cancellation until the child has successfully been
        // executed. We make a number of POSIX calls in the child that are thread
        // cancellation points and could cause an unexpected stack unwind. That
        // would be bad enough with regular fork(), but it's likely fatal with
        // vfork().
        disableThreadCancellations();
    }